

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool s2textformat::MakeIndex
               (string_view str,
               unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *index)

{
  MutableS2ShapeIndex *this;
  pointer psVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  absl *this_00;
  size_type sVar5;
  pointer *__ptr;
  char separator;
  undefined8 in_R8;
  string_view *point_str;
  S2Shape *pSVar6;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view piece;
  _Vector_base<absl::string_view,_std::allocator<absl::string_view>_> local_c8;
  _Head_base<0UL,_S2Shape_*,_false> local_b0;
  _Head_base<0UL,_S2Shape_*,_false> local_a8;
  _Head_base<0UL,_S2Shape_*,_false> local_a0;
  S2Point point;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<absl::string_view,_std::allocator<absl::string_view>_> strs;
  string_view str_local;
  
  str_local.length_ = str.length_;
  str_local.ptr_ = str.ptr_;
  absl::StrSplit<absl::string_view>(&strs,&str_local,'#');
  if ((long)strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
            super__Vector_impl_data._M_start != 0x30) {
    sVar5 = 3;
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&points,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    poVar4 = std::operator<<((ostream *)
                             points.
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish,
                             "Check failed: (3) == (strs.size()) ");
    this_00 = (absl *)std::operator<<(poVar4,"Must contain two # characters: ");
    piece.length_ = sVar5;
    piece.ptr_ = (char *)str_local.length_;
    absl::operator<<(this_00,(ostream *)str_local.ptr_,piece);
    abort();
  }
  points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  str_00.length_ = 0x7c;
  str_00.ptr_ = (char *)(strs.
                         super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                         _M_impl.super__Vector_impl_data._M_start)->length_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)&local_c8,
              (s2textformat *)
              (strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
               _M_impl.super__Vector_impl_data._M_start)->ptr_,str_00,(char)in_R8);
  psVar1 = local_c8._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar6 = (S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_start;
      pSVar6 != (S2Shape *)psVar1; pSVar6 = pSVar6 + 1) {
    point.c_[2] = 0.0;
    point.c_[0] = 0.0;
    point.c_[1] = 0.0;
    bVar2 = MakePoint((string_view)*pSVar6,&point);
    if (!bVar2) goto LAB_002632e4;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&points,&point);
  }
  std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base(&local_c8)
  ;
  if (points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = (index->_M_t).
           super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>.
           _M_t.
           super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>.
           super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl;
    absl::
    make_unique<S2PointVectorShape,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_c8,&points);
    local_a0._M_head_impl = (S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_start;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    MutableS2ShapeIndex::Add(this,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_a0);
    if (local_a0._M_head_impl != (S2Shape *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_a0._M_head_impl = (S2Shape *)0x0;
    if ((S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_start != (S2Shape *)0x0) {
      (**(_func_int **)((long)(local_c8._M_impl.super__Vector_impl_data._M_start)->ptr_ + 8))();
    }
  }
  str_01.length_ = 0x7c;
  str_01.ptr_ = (char *)strs.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].length_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)&local_c8,
              (s2textformat *)
              strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl
              .super__Vector_impl_data._M_start[1].ptr_,str_01,(char)in_R8);
  psVar1 = local_c8._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar6 = (S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_start;
      separator = (char)in_R8, pSVar6 != (S2Shape *)psVar1; pSVar6 = pSVar6 + 1) {
    point.c_[0] = 0.0;
    bVar2 = MakeLaxPolyline((string_view)*pSVar6,
                            (unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                             *)&point);
    if (!bVar2) {
      if (point.c_[0] != 0.0) {
        (**(code **)(*(long *)point.c_[0] + 8))();
      }
LAB_002632e4:
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                (&local_c8);
      bVar2 = false;
      goto LAB_00263308;
    }
    local_a8._M_head_impl = (S2Shape *)point.c_[0];
    MutableS2ShapeIndex::Add
              ((index->_M_t).
               super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
               ._M_t.
               super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
               .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
               (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_a8);
    if (local_a8._M_head_impl != (S2Shape *)0x0) {
      (*(local_a8._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_a8._M_head_impl = (S2Shape *)0x0;
  }
  std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base(&local_c8)
  ;
  str_02.length_ = 0x7c;
  str_02.ptr_ = (char *)strs.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start[2].length_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)&local_c8,
              (s2textformat *)
              strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl
              .super__Vector_impl_data._M_start[2].ptr_,str_02,separator);
  pSVar6 = (S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar2 = pSVar6 == (S2Shape *)local_c8._M_impl.super__Vector_impl_data._M_finish;
    if (bVar2) {
LAB_00263300:
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                (&local_c8);
LAB_00263308:
      std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                (&points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>);
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                (&strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>);
      return bVar2;
    }
    point.c_[0] = 0.0;
    bVar3 = MakeLaxPolygon((string_view)*pSVar6,
                           (unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *
                           )&point);
    if (!bVar3) {
      if (point.c_[0] != 0.0) {
        (**(code **)(*(long *)point.c_[0] + 8))();
      }
      goto LAB_00263300;
    }
    local_b0._M_head_impl = (S2Shape *)point.c_[0];
    MutableS2ShapeIndex::Add
              ((index->_M_t).
               super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
               ._M_t.
               super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
               .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
               (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_b0);
    if (local_b0._M_head_impl != (S2Shape *)0x0) {
      (*(local_b0._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_b0._M_head_impl = (S2Shape *)0x0;
    pSVar6 = pSVar6 + 1;
  } while( true );
}

Assistant:

bool MakeIndex(string_view str, std::unique_ptr<MutableS2ShapeIndex>* index) {
  vector<string_view> strs = absl::StrSplit(str, '#');
  S2_DCHECK_EQ(3, strs.size()) << "Must contain two # characters: " << str;

  vector<S2Point> points;
  for (const auto& point_str : SplitString(strs[0], '|')) {
    S2Point point;
    if (!MakePoint(point_str, &point)) return false;
    points.push_back(point);
  }
  if (!points.empty()) {
    (*index)->Add(make_unique<S2PointVectorShape>(std::move(points)));
  }
  for (const auto& line_str : SplitString(strs[1], '|')) {
    std::unique_ptr<S2LaxPolylineShape> lax_polyline;
    if (!MakeLaxPolyline(line_str, &lax_polyline)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polyline.release()));
  }
  for (const auto& polygon_str : SplitString(strs[2], '|')) {
    std::unique_ptr<S2LaxPolygonShape> lax_polygon;
    if (!MakeLaxPolygon(polygon_str, &lax_polygon)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polygon.release()));
  }
  return true;
}